

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg-traversal.h
# Opt level: O0

void wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>
     ::doEndTryTable(SpillPointers *self,Expression **currp)

{
  bool bVar1;
  reference pNVar2;
  reference this;
  reference ppBVar3;
  mapped_type *this_00;
  BasicBlock *local_a0;
  BasicBlock *pred;
  iterator __end0;
  iterator __begin0;
  value_type *__range3;
  value_type *preds;
  Name target;
  iterator __end2;
  iterator __begin2;
  NameSet *__range2;
  NameSet catchTargets;
  TryTable *curr;
  Expression **currp_local;
  SpillPointers *self_local;
  
  catchTargets._M_t._M_impl.super__Rb_tree_header._M_node_count =
       (size_t)Expression::cast<wasm::TryTable>(*currp);
  BranchUtils::getUniqueTargets
            ((NameSet *)&__range2,
             (Expression *)catchTargets._M_t._M_impl.super__Rb_tree_header._M_node_count);
  __end2 = std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>::begin
                     ((set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> *)
                      &__range2);
  target.super_IString.str._M_str =
       (char *)std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>::end
                         ((set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> *)
                          &__range2);
  while( true ) {
    bVar1 = std::operator!=(&__end2,(_Self *)&target.super_IString.str._M_str);
    if (!bVar1) break;
    pNVar2 = std::_Rb_tree_const_iterator<wasm::Name>::operator*(&__end2);
    preds = (value_type *)(pNVar2->super_IString).str._M_len;
    target.super_IString.str._M_len = (size_t)(pNVar2->super_IString).str._M_str;
    this = std::
           vector<std::vector<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*>_>,_std::allocator<std::vector<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*>_>_>_>
           ::back(&(self->
                   super_WalkerPass<wasm::LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>_>
                   ).
                   super_LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>
                   .
                   super_CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>
                   .throwingInstsStack);
    __end0 = std::
             vector<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*>_>
             ::begin(this);
    pred = (BasicBlock *)
           std::
           vector<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*>_>
           ::end(this);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end0,(__normal_iterator<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_**,_std::vector<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*>_>_>
                                  *)&pred);
      if (!bVar1) break;
      ppBVar3 = __gnu_cxx::
                __normal_iterator<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_**,_std::vector<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*>_>_>
                ::operator*(&__end0);
      local_a0 = *ppBVar3;
      this_00 = std::
                map<wasm::Name,_std::vector<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*>_>_>_>_>
                ::operator[](&(self->
                              super_WalkerPass<wasm::LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>_>
                              ).
                              super_LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>
                              .
                              super_CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>
                              .branches,(key_type *)&preds);
      std::
      vector<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*>_>
      ::push_back(this_00,&local_a0);
      __gnu_cxx::
      __normal_iterator<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_**,_std::vector<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*>_>_>
      ::operator++(&__end0);
    }
    std::_Rb_tree_const_iterator<wasm::Name>::operator++(&__end2);
  }
  std::
  vector<std::vector<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*>_>,_std::allocator<std::vector<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*>_>_>_>
  ::pop_back(&(self->
              super_WalkerPass<wasm::LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>_>
              ).super_LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>
              .
              super_CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>
              .throwingInstsStack);
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::pop_back
            (&(self->
              super_WalkerPass<wasm::LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>_>
              ).super_LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>
              .
              super_CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>
              .tryStack);
  std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>::~set
            ((set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> *)&__range2);
  return;
}

Assistant:

static void doEndTryTable(SubType* self, Expression** currp) {
    auto* curr = (*currp)->cast<TryTable>();

    auto catchTargets = BranchUtils::getUniqueTargets(curr);
    // Add catch destinations to the targets.
    for (auto target : catchTargets) {
      auto& preds = self->throwingInstsStack.back();
      for (auto* pred : preds) {
        self->branches[target].push_back(pred);
      }
    }

    self->throwingInstsStack.pop_back();
    self->tryStack.pop_back();
  }